

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O3

iterator __thiscall QJsonObject::findImpl<QLatin1String>(QJsonObject *this,QLatin1String key)

{
  QCborContainerPrivate *pQVar1;
  qsizetype qVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  iterator iVar4;
  bool keyExists;
  bool local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_19 = false;
  if ((this->o).d.ptr != (QCborContainerPrivate *)0x0) {
    qVar2 = indexOf<QLatin1String>(&this->o,key,&local_19);
    if ((local_19 & 1U) != 0) {
      uVar3 = qVar2 - (qVar2 >> 0x3f) | 1;
      detach(this,0);
      goto LAB_002f1e73;
    }
  }
  detach(this,0);
  pQVar1 = (this->o).d.ptr;
  if (pQVar1 == (QCborContainerPrivate *)0x0) {
    uVar3 = 1;
  }
  else {
    uVar3 = (pQVar1->elements).d.size | 1;
  }
LAB_002f1e73:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    iVar4.item.super_QJsonValueConstRef._8_8_ = uVar3;
    iVar4.item.super_QJsonValueConstRef.field_0.o = this;
    return (iterator)iVar4.item.super_QJsonValueConstRef;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject::iterator QJsonObject::findImpl(T key)
{
    bool keyExists = false;
    auto index = o ? indexOf(o, key, &keyExists) : 0;
    if (!keyExists)
        return end();
    detach();
    return {this, index / 2};
}